

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3rbu * sqlite3rbu_vacuum(char *zTarget,char *zState)

{
  int iVar1;
  size_t sVar2;
  sqlite3rbu *psVar3;
  
  if (zTarget != (char *)0x0) {
    if (zState != (char *)0x0) {
      sVar2 = strlen(zState);
      if (6 < (int)sVar2) {
        iVar1 = bcmp("-vactmp",zState + ((int)sVar2 - 7),7);
        if (iVar1 == 0) goto LAB_0012c15a;
      }
    }
    psVar3 = openRbuHandle((char *)0x0,zTarget,zState);
    return psVar3;
  }
LAB_0012c15a:
  psVar3 = rbuMisuseError();
  return psVar3;
}

Assistant:

SQLITE_API sqlite3rbu *sqlite3rbu_vacuum(
  const char *zTarget, 
  const char *zState
){
  if( zTarget==0 ){ return rbuMisuseError(); }
  if( zState ){
    int n = strlen(zState);
    if( n>=7 && 0==memcmp("-vactmp", &zState[n-7], 7) ){
      return rbuMisuseError();
    }
  }
  /* TODO: Check that both arguments are non-NULL */
  return openRbuHandle(0, zTarget, zState);
}